

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

ImportCacheValue * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::importData
          (Interpreter *this,LocationRange *loc,LiteralString *file)

{
  JsonnetImportCallback *pJVar1;
  void *pvVar2;
  int iVar3;
  mapped_type *ppIVar4;
  mapped_type pIVar5;
  RuntimeError *__return_storage_ptr__;
  UString *__y;
  char *buf;
  size_t buflen;
  char *found_here_cptr;
  string input;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string dir;
  string epath;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  key;
  
  path_dir_with_trailing_separator(&dir,&loc->file);
  __y = &file->value;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&key,&dir,__y);
  ppIVar4 = std::
            map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
            ::operator[](&this->cachedImports,&key);
  pIVar5 = *ppIVar4;
  if (pIVar5 == (mapped_type)0x0) {
    buf = (char *)0x0;
    buflen = 0;
    pJVar1 = this->importCallback;
    pvVar2 = this->importCallbackContext;
    encode_utf8(&input,__y);
    iVar3 = (*pJVar1)(pvVar2,dir._M_dataplus._M_p,input._M_dataplus._M_p,&found_here_cptr,&buf,
                      &buflen);
    std::__cxx11::string::~string((string *)&input);
    input._M_dataplus._M_p = (pointer)&input.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&input,buf,buf + buflen);
    free(buf);
    if (iVar3 == 1) {
      jsonnet_string_escape((UString *)&msg,__y,false);
      encode_utf8(&epath,(UString *)&msg);
      std::__cxx11::u32string::~u32string((u32string *)&msg);
      std::operator+(&local_d0,"couldn\'t open import \"",&epath);
      std::operator+(&msg,&local_d0,"\": ");
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::append((string *)&msg);
      __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
      Stack::makeError(__return_storage_ptr__,&this->stack,loc,&msg);
      __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    pIVar5 = (mapped_type)operator_new(0x48);
    (pIVar5->content)._M_dataplus._M_p = (pointer)0x0;
    (pIVar5->content)._M_string_length = 0;
    (pIVar5->content).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pIVar5->content).field_2 + 8) = 0;
    (pIVar5->foundHere).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pIVar5->foundHere).field_2 + 8) = 0;
    pIVar5->thunk = (HeapThunk *)0x0;
    (pIVar5->foundHere)._M_dataplus._M_p = (pointer)&(pIVar5->foundHere).field_2;
    (pIVar5->foundHere)._M_string_length = 0;
    (pIVar5->content)._M_dataplus._M_p = (pointer)&(pIVar5->content).field_2;
    (pIVar5->content).field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)pIVar5);
    std::__cxx11::string::_M_assign((string *)&pIVar5->content);
    pIVar5->thunk = (HeapThunk *)0x0;
    free(found_here_cptr);
    ppIVar4 = std::
              map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
              ::operator[](&this->cachedImports,&key);
    *ppIVar4 = pIVar5;
    std::__cxx11::string::~string((string *)&input);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::~pair(&key);
  std::__cxx11::string::~string((string *)&dir);
  return pIVar5;
}

Assistant:

ImportCacheValue *importData(const LocationRange &loc, const LiteralString *file)
    {
        // `dir` is passed to the importCallback, which may be externally defined.
        // For backwards compatibility, we need to keep the trailing directory separator.
        // For example, the default callback in libjsonnet.cpp joins paths with simple
        // string concatenation. Other (external) implementations might do the same.
        std::string dir = path_dir_with_trailing_separator(loc.file);

        const UString &path = file->value;

        std::pair<std::string, UString> key(dir, path);
        ImportCacheValue *cached_value = cachedImports[key];
        if (cached_value != nullptr)
            return cached_value;

        char *found_here_cptr;
        char *buf = NULL;
        size_t buflen = 0;
        int result = importCallback(importCallbackContext,
                                    dir.c_str(),
                                    encode_utf8(path).c_str(),
                                    &found_here_cptr,
                                    &buf,
                                    &buflen);

        std::string input(buf, buflen);
        ::free(buf);

        if (result == 1) {  // failure
            std::string epath = encode_utf8(jsonnet_string_escape(path, false));
            std::string msg = "couldn't open import \"" + epath + "\": ";
            msg += input;
            throw makeError(loc, msg);
        }

        auto *input_ptr = new ImportCacheValue();
        input_ptr->foundHere = found_here_cptr;
        input_ptr->content = input;
        input_ptr->thunk = nullptr;  // May be filled in later by import().
        ::free(found_here_cptr);
        cachedImports[key] = input_ptr;
        return input_ptr;
    }